

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar6;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"GetRepeatedMessage");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_local = (Reflection *)internal::ExtensionSet::GetRepeatedMessage(this_00,number,index);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar6 = internal::MapFieldBase::GetRepeatedField(this_01);
      this_local = (Reflection *)
                   internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (pRVar6,index);
    }
    else {
      pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      this_local = (Reflection *)
                   internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (pRVar6,index);
    }
  }
  return (Message *)this_local;
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}